

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall
OpenMD::SelectionCompiler::compile(SelectionCompiler *this,string *filename,string *script)

{
  pointer piVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  long lVar5;
  pointer this_00;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->script);
  piVar1 = (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  pvVar2 = (this->aatokenCompiled).
           super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->aatokenCompiled).
           super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar2;
  if (pvVar3 != pvVar2) {
    do {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar3);
    (this->aatokenCompiled).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  bVar4 = internalCompile(this);
  if (!bVar4) {
    lVar5 = std::__cxx11::string::find((char)script,0xd);
    if (lVar5 == -1) {
      std::__cxx11::string::find((char)script,10);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)script);
    std::__cxx11::string::operator=((string *)&this->errorLine,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return bVar4;
}

Assistant:

bool SelectionCompiler::compile(const std::string& filename,
                                  const std::string& script) {
    this->filename = filename;
    this->script   = script;
    lineNumbers.clear();
    lineIndices.clear();
    aatokenCompiled.clear();

    if (internalCompile()) { return true; }

    std::size_t icharEnd;
    if ((icharEnd = script.find('\r', ichCurrentCommand)) ==
            std::string::npos &&
        (icharEnd = script.find('\n', ichCurrentCommand)) ==
            std::string::npos) {
      icharEnd = script.size();
    }
    errorLine = script.substr(ichCurrentCommand, icharEnd);
    return false;
  }